

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddFile<google::protobuf::FileDescriptorProto>
          (DescriptorIndex *this,FileDescriptorProto *file,Value value)

{
  void **ppvVar1;
  byte bVar2;
  bool bVar3;
  long *plVar4;
  Rep *pRVar5;
  undefined8 *puVar6;
  long lVar7;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  DescriptorProto *message_type;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_02;
  FieldDescriptorProto *field;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_03;
  RepeatedPtrField<google::protobuf::DescriptorProto> *pRVar8;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *pRVar9;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar10;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *pRVar11;
  bool bVar12;
  string_view symbol;
  string_view filename;
  string_view symbol_00;
  string_view symbol_01;
  string_view symbol_02;
  string_view symbol_03;
  string_view filename_00;
  string_view symbol_04;
  string_view symbol_05;
  string_view symbol_06;
  string_view str;
  string_view str_00;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  _Alloc_hider local_68;
  undefined1 local_60 [24];
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>,_bool>
  local_48;
  
  local_78 = (undefined1  [8])value.first;
  local_70._M_p._0_4_ = value.second;
  local_60._0_8_ = 0;
  local_60[8] = '\0';
  local_68._M_p = local_60 + 8;
  std::
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
  ::emplace_back<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>
            (&this->all_values_,(EncodedEntry *)local_78);
  if (local_68._M_p != local_60 + 8) {
    operator_delete(local_68._M_p,CONCAT71(local_60._9_7_,local_60[8]) + 1);
  }
  plVar4 = (long *)((ulong)(file->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  bVar12 = plVar4[1] == 0;
  if (!bVar12) {
    lVar7 = 0;
    do {
      bVar2 = *(byte *)(*plVar4 + lVar7);
      if ((((bVar2 != 0x2e) && (bVar2 != 0x5f)) && ((byte)(bVar2 - 0x3a) < 0xf6)) &&
         ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) break;
      lVar7 = lVar7 + 1;
      bVar12 = plVar4[1] == lVar7;
    } while (!bVar12);
  }
  if (bVar12) {
    local_78 = (undefined1  [8])&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,*plVar4,plVar4[1] + *plVar4);
    std::__cxx11::string::operator=
              ((string *)
               &(this->all_values_).
                super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].encoded_package,(string *)local_78);
    if (local_78 != (undefined1  [8])&local_68) {
      operator_delete((void *)local_78,(ulong)(local_68._M_p + 1));
    }
    local_78._0_4_ =
         (int)((ulong)((long)(this->all_values_).
                             super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->all_values_).
                            super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 + -1;
    plVar4 = (long *)((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    lVar7 = *plVar4;
    local_70._M_p = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,lVar7,plVar4[1] + lVar7);
    absl::lts_20250127::container_internal::
    btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>
    ::
    insert_unique<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>
              (&local_48,&this->by_name_,(FileEntry *)local_78,(FileEntry *)local_78);
    if (local_48.second == true) {
      bVar12 = std::
               binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>,std::__cxx11::string,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                         ((this->by_name_flat_).
                          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->by_name_flat_).
                          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                          ),(this->by_name_).
                            super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                            .
                            super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                            .tree_.rightmost_.
                            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                            .
                            super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare,_0UL,_false>
                            .value.
                            super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_true>
                            .super_FileCompare.index);
      if (local_70._M_p != local_60) {
        operator_delete(local_70._M_p,local_60._0_8_ + 1);
      }
      if (!bVar12) {
        this_00 = &(file->field_0)._impl_.message_type_;
        pRVar8 = this_00;
        if ((*(byte *)((long)&file->field_0 + 0x20) & 1) != 0) {
          pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
          pRVar8 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar5->elements;
        }
        if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
          this_00 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar5->elements;
        }
        ppvVar1 = &(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                  *(int *)((long)&file->field_0 + 0x28);
        bVar12 = pRVar8 == (RepeatedPtrField<google::protobuf::DescriptorProto> *)ppvVar1;
        if (!bVar12) {
          message_type = (DescriptorProto *)(pRVar8->super_RepeatedPtrFieldBase).tagged_rep_or_elem_
          ;
          puVar6 = (undefined8 *)
                   ((ulong)(message_type->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                   0xfffffffffffffffc);
          symbol._M_str = (char *)*puVar6;
          symbol._M_len = puVar6[1];
          bVar3 = AddSymbol(this,symbol);
          if (bVar3) {
            do {
              pRVar8 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)
                       &(pRVar8->super_RepeatedPtrFieldBase).current_size_;
              puVar6 = (undefined8 *)
                       ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
              filename._M_str = (char *)*puVar6;
              filename._M_len = puVar6[1];
              bVar3 = AddNestedExtensions<google::protobuf::DescriptorProto>
                                (this,filename,message_type);
              if (!bVar3) break;
              bVar12 = pRVar8 == (RepeatedPtrField<google::protobuf::DescriptorProto> *)ppvVar1;
              if (bVar12) goto LAB_00269ea1;
              message_type = *(DescriptorProto **)pRVar8;
              puVar6 = (undefined8 *)
                       ((ulong)(message_type->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                       0xfffffffffffffffc);
              symbol_00._M_str = (char *)*puVar6;
              symbol_00._M_len = puVar6[1];
              bVar3 = AddSymbol(this,symbol_00);
            } while (bVar3);
          }
          if (!bVar12) {
            return false;
          }
        }
LAB_00269ea1:
        this_01 = &(file->field_0)._impl_.enum_type_;
        pRVar9 = this_01;
        if ((*(byte *)((long)&file->field_0 + 0x38) & 1) != 0) {
          pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
          pRVar9 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)pRVar5->elements;
        }
        if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
          this_01 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)pRVar5->elements;
        }
        ppvVar1 = &(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                  *(int *)((long)&file->field_0 + 0x40);
        bVar12 = pRVar9 == (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)ppvVar1;
        if (!bVar12) {
          puVar6 = (undefined8 *)
                   (*(ulong *)((long)(pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + 0x60
                              ) & 0xfffffffffffffffc);
          symbol_01._M_str = (char *)*puVar6;
          symbol_01._M_len = puVar6[1];
          bVar3 = AddSymbol(this,symbol_01);
          if (bVar3) {
            do {
              pRVar9 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
                       &(pRVar9->super_RepeatedPtrFieldBase).current_size_;
              bVar12 = pRVar9 == (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)ppvVar1;
              if (bVar12) goto LAB_00269f3a;
              puVar6 = (undefined8 *)(*(ulong *)(*(long *)pRVar9 + 0x60) & 0xfffffffffffffffc);
              symbol_02._M_str = (char *)*puVar6;
              symbol_02._M_len = puVar6[1];
              bVar3 = AddSymbol(this,symbol_02);
            } while (bVar3);
          }
          if (!bVar12) {
            return false;
          }
        }
LAB_00269f3a:
        this_02 = &(file->field_0)._impl_.extension_;
        pRVar10 = this_02;
        if ((*(byte *)((long)&file->field_0 + 0x68) & 1) != 0) {
          pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
          pRVar10 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar5->elements;
        }
        if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
          this_02 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar5->elements;
        }
        ppvVar1 = &(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                  *(int *)((long)&file->field_0 + 0x70);
        bVar12 = pRVar10 == (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)ppvVar1;
        if (!bVar12) {
          field = (FieldDescriptorProto *)(pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
          puVar6 = (undefined8 *)
                   ((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
          symbol_03._M_str = (char *)*puVar6;
          symbol_03._M_len = puVar6[1];
          bVar3 = AddSymbol(this,symbol_03);
          if (bVar3) {
            do {
              pRVar10 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                        &(pRVar10->super_RepeatedPtrFieldBase).current_size_;
              puVar6 = (undefined8 *)
                       ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
              filename_00._M_str = (char *)*puVar6;
              filename_00._M_len = puVar6[1];
              bVar3 = AddExtension<google::protobuf::FieldDescriptorProto>(this,filename_00,field);
              if (!bVar3) break;
              bVar12 = pRVar10 ==
                       (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)ppvVar1;
              if (bVar12) goto LAB_00269ffa;
              field = *(FieldDescriptorProto **)pRVar10;
              puVar6 = (undefined8 *)
                       ((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
              symbol_04._M_str = (char *)*puVar6;
              symbol_04._M_len = puVar6[1];
              bVar3 = AddSymbol(this,symbol_04);
            } while (bVar3);
          }
          if (!bVar12) {
            return false;
          }
        }
LAB_00269ffa:
        this_03 = &(file->field_0)._impl_.service_;
        pRVar11 = this_03;
        if ((*(byte *)((long)&file->field_0 + 0x50) & 1) != 0) {
          pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_03->super_RepeatedPtrFieldBase);
          pRVar11 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)pRVar5->elements;
        }
        if (((ulong)(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_03->super_RepeatedPtrFieldBase);
          this_03 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)pRVar5->elements;
        }
        ppvVar1 = &(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                  *(int *)((long)&file->field_0 + 0x58);
        bVar12 = pRVar11 == (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)ppvVar1;
        if (!bVar12) {
          puVar6 = (undefined8 *)
                   (*(ulong *)((long)(pRVar11->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                              0x30) & 0xfffffffffffffffc);
          symbol_05._M_str = (char *)*puVar6;
          symbol_05._M_len = puVar6[1];
          bVar3 = AddSymbol(this,symbol_05);
          if (!bVar3) {
            return bVar12;
          }
          do {
            pRVar11 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
                      &(pRVar11->super_RepeatedPtrFieldBase).current_size_;
            bVar12 = pRVar11 ==
                     (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)ppvVar1;
            if (bVar12) {
              return bVar12;
            }
            puVar6 = (undefined8 *)(*(ulong *)(*(long *)pRVar11 + 0x30) & 0xfffffffffffffffc);
            symbol_06._M_str = (char *)*puVar6;
            symbol_06._M_len = puVar6[1];
            bVar3 = AddSymbol(this,symbol_06);
          } while (bVar3);
          return bVar12;
        }
        return bVar12;
      }
    }
    else if (local_70._M_p != local_60) {
      operator_delete(local_70._M_p,local_60._0_8_ + 1);
    }
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x2a6);
    str_00._M_str = "File already exists in database: ";
    str_00._M_len = 0x21;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_78,str_00);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)local_78,
               (string *)((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
              );
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x29b);
    str._M_str = "Invalid package name: ";
    str._M_len = 0x16;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_78,str);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)local_78,
               (string *)
               ((ulong)(file->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  }
  absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)local_78);
  return false;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddFile(const FileProto& file,
                                                         Value value) {
  // We push `value` into the array first. This is important because the AddXXX
  // functions below will expect it to be there.
  all_values_.push_back({value.first, value.second, {}});

  if (!ValidateSymbolName(file.package())) {
    ABSL_LOG(ERROR) << "Invalid package name: " << file.package();
    return false;
  }
  all_values_.back().encoded_package = EncodeString(file.package());

  if (!by_name_
           .insert({static_cast<int>(all_values_.size() - 1),
                    EncodeString(file.name())})
           .second ||
      std::binary_search(by_name_flat_.begin(), by_name_flat_.end(),
                         file.name(), by_name_.key_comp())) {
    ABSL_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  for (const auto& message_type : file.message_type()) {
    if (!AddSymbol(message_type.name())) return false;
    if (!AddNestedExtensions(file.name(), message_type)) return false;
  }
  for (const auto& enum_type : file.enum_type()) {
    if (!AddSymbol(enum_type.name())) return false;
  }
  for (const auto& extension : file.extension()) {
    if (!AddSymbol(extension.name())) return false;
    if (!AddExtension(file.name(), extension)) return false;
  }
  for (const auto& service : file.service()) {
    if (!AddSymbol(service.name())) return false;
  }

  return true;
}